

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

BOOL Js::JavascriptOperators::Equal_Full(Var aLeft,Var aRight,ScriptContext *requestContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  RecyclableObject *pRVar5;
  uint lineNumber;
  double dVar6;
  double dVar7;
  uint local_34 [2];
  BOOL result;
  
  if (aLeft == aRight) {
    if (((ulong)aLeft >> 0x32 != 0) &&
       (bVar2 = NumberUtilities::IsNan((double)((ulong)aLeft ^ 0xfffc000000000000)), bVar2)) {
      return 0;
    }
    return 1;
  }
  local_34[0] = 0;
  if (((ulong)aLeft & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aLeft & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aLeft & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa59dd;
    if ((ulong)aLeft >> 0x32 == 0) {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aLeft);
      iVar3 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aRight,local_34,requestContext);
      if (iVar3 != 0) {
        return local_34[0];
      }
      return 0;
    }
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00aa5c73;
      *puVar4 = 0;
LAB_00aa5baa:
      dVar7 = (double)(int)aRight;
      dVar6 = (double)((ulong)aLeft ^ 0xfffc000000000000);
      goto LAB_00aa5bc4;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) goto LAB_00aa5baa;
    if (aRight < (Var)0x4000000000000) {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      iVar3 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aLeft,local_34,requestContext);
      if (iVar3 != 0) {
        return local_34[0];
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      lineNumber = 0x251;
      goto LAB_00aa5b8d;
    }
    dVar7 = (double)((ulong)aLeft ^ 0xfffc000000000000);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00aa5c73;
    *puVar4 = 0;
LAB_00aa59dd:
    if (((ulong)aRight & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (bVar2) {
        *puVar4 = 0;
        return 0;
      }
      goto LAB_00aa5c73;
    }
    if (((ulong)aRight & 0xffff000000000000) == 0x1000000000000) {
      return 0;
    }
    if ((ulong)aRight >> 0x32 == 0) {
      pRVar5 = UnsafeVarTo<Js::RecyclableObject>(aRight);
      iVar3 = (*(pRVar5->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x2e])(pRVar5,aLeft,local_34,requestContext);
      if (iVar3 != 0) {
        return local_34[0];
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      lineNumber = 0x240;
LAB_00aa5b8d:
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,lineNumber,"(res)","Should have handled this");
      if (bVar2) {
        *puVar4 = 0;
        return local_34[0];
      }
LAB_00aa5c73:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    dVar7 = (double)(int)aLeft;
  }
  dVar6 = (double)((ulong)aRight ^ 0xfffc000000000000);
LAB_00aa5bc4:
  return -(uint)(dVar6 == dVar7) & 1;
}

Assistant:

BOOL JavascriptOperators::Equal_Full(Var aLeft, Var aRight, ScriptContext* requestContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_Equal_Full);
        //
        // Fast-path SmInts and paired Number combinations.
        //

        if (aLeft == aRight)
        {
            if (JavascriptNumber::Is(aLeft) && JavascriptNumber::IsNan(JavascriptNumber::GetValue(aLeft)))
            {
                return false;
            }
            else
            {
                return true;
            }
        }

        BOOL result = false;

        if (TaggedInt::Is(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                // If aLeft == aRight, we would already have returned true above.
                return false;
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return TaggedInt::ToDouble(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }
        else if (JavascriptNumber::Is_NoTaggedIntCheck(aLeft))
        {
            if (TaggedInt::Is(aRight))
            {
                return TaggedInt::ToDouble(aRight) == JavascriptNumber::GetValue(aLeft);
            }
            else if(JavascriptNumber::Is_NoTaggedIntCheck(aRight))
            {
                return JavascriptNumber::GetValue(aLeft) == JavascriptNumber::GetValue(aRight);
            }
            else
            {
                BOOL res = UnsafeVarTo<RecyclableObject>(aRight)->Equals(aLeft, &result, requestContext);
                AssertMsg(res, "Should have handled this");
                return result;
            }
        }

        if (UnsafeVarTo<RecyclableObject>(aLeft)->Equals(aRight, &result, requestContext))
        {
            return result;
        }
        else
        {
            return false;
        }
        JIT_HELPER_END(Op_Equal_Full);
    }